

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O0

int __thiscall
FResourceFile::FilterLumps
          (FResourceFile *this,FString *filtername,void *lumps,size_t lumpsize,DWORD max)

{
  FResourceLump *this_00;
  bool bVar1;
  int iVar2;
  FString *pFVar3;
  size_t sVar4;
  ulong __n;
  void *__dest;
  void *__dest_00;
  BYTE *filteredlumps;
  void *to;
  size_t count;
  FResourceLump *local_80;
  FResourceLump *lump;
  FResourceLump *pFStack_70;
  DWORD i;
  void *lump_p;
  void *from;
  undefined4 local_58;
  uint local_48;
  uint local_44;
  DWORD end;
  DWORD start;
  FString filter;
  DWORD max_local;
  size_t lumpsize_local;
  void *lumps_local;
  FString *filtername_local;
  FResourceFile *this_local;
  
  filter.Chars._4_4_ = max;
  FString::FString((FString *)&end);
  bVar1 = FString::IsEmpty(filtername);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    pFVar3 = FString::operator<<((FString *)&end,"filter/");
    pFVar3 = FString::operator<<(pFVar3,filtername);
    FString::operator<<(pFVar3,'/');
    FString::FString((FString *)&from,(FString *)&end);
    bVar1 = FindPrefixRange(this,(FString *)&from,lumps,lumpsize,filter.Chars._4_4_,&local_44,
                            &local_48);
    FString::~FString((FString *)&from);
    if (bVar1) {
      pFStack_70 = (FResourceLump *)((long)lumps + local_44 * lumpsize);
      lump_p = pFStack_70;
      for (lump._4_4_ = local_44; lump._4_4_ < local_48; lump._4_4_ = lump._4_4_ + 1) {
        local_80 = pFStack_70;
        pFVar3 = &pFStack_70->FullName;
        sVar4 = FString::Len((FString *)&end);
        iVar2 = FString::CompareNoCase(pFVar3,(FString *)&end,(int)sVar4);
        this_00 = local_80;
        if (iVar2 != 0) {
          __assert_fail("lump->FullName.CompareNoCase(filter, (int)filter.Len()) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/resourcefile.cpp"
                        ,0x188,"int FResourceFile::FilterLumps(FString, void *, size_t, DWORD)");
        }
        pFVar3 = &local_80->FullName;
        sVar4 = FString::Len((FString *)&end);
        FString::Mid((FString *)&count,(size_t)pFVar3,sVar4);
        FResourceLump::LumpNameSetup(this_00,(FString *)&count);
        FString::~FString((FString *)&count);
        pFStack_70 = (FResourceLump *)((long)&pFStack_70->_vptr_FResourceLump + lumpsize);
      }
      __n = (local_48 - local_44) * lumpsize;
      __dest = (void *)((long)lumps + (this->NumLumps * lumpsize - __n));
      if (__dest < lump_p) {
        __assert_fail("to >= from",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/resourcefile.cpp"
                      ,399,"int FResourceFile::FilterLumps(FString, void *, size_t, DWORD)");
      }
      if (lump_p != __dest) {
        __dest_00 = operator_new__(__n);
        memcpy(__dest_00,lump_p,__n);
        memmove(lump_p,(void *)((long)lump_p + __n),(this->NumLumps - local_48) * lumpsize);
        memcpy(__dest,__dest_00,__n);
        if (__dest_00 != (void *)0x0) {
          operator_delete__(__dest_00);
        }
      }
    }
    this_local._4_4_ = local_48 - local_44;
  }
  local_58 = 1;
  FString::~FString((FString *)&end);
  return this_local._4_4_;
}

Assistant:

int FResourceFile::FilterLumps(FString filtername, void *lumps, size_t lumpsize, DWORD max)
{
	FString filter;
	DWORD start, end;

	if (filtername.IsEmpty())
	{
		return 0;
	}
	filter << "filter/" << filtername << '/';
	if (FindPrefixRange(filter, lumps, lumpsize, max, start, end))
	{
		void *from = (BYTE *)lumps + start * lumpsize;

		// Remove filter prefix from every name
		void *lump_p = from;
		for (DWORD i = start; i < end; ++i, lump_p = (BYTE *)lump_p + lumpsize)
		{
			FResourceLump *lump = (FResourceLump *)lump_p;
			assert(lump->FullName.CompareNoCase(filter, (int)filter.Len()) == 0);
			lump->LumpNameSetup(lump->FullName.Mid(filter.Len()));
		}

		// Move filtered lumps to the end of the lump list.
		size_t count = (end - start) * lumpsize;
		void *to = (BYTE *)lumps + NumLumps * lumpsize - count;
		assert (to >= from);

		if (from != to)
		{
			// Copy filtered lumps to a temporary buffer.
			BYTE *filteredlumps = new BYTE[count];
			memcpy(filteredlumps, from, count);

			// Shift lumps left to make room for the filtered ones at the end.
			memmove(from, (BYTE *)from + count, (NumLumps - end) * lumpsize);

			// Copy temporary buffer to newly freed space.
			memcpy(to, filteredlumps, count);

			delete[] filteredlumps;
		}
	}
	return end - start;
}